

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolve.hpp
# Opt level: O0

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::calculateProblemRanges
          (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this)

{
  int iVar1;
  type_conflict5 tVar2;
  int iVar3;
  long in_RDI;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  absrhs;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  abslhs;
  int i;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  absobj;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  absupp;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  abslow;
  int j;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxside;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  minside;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxbound;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  minbound;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxobj;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  minobj;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_2;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_2;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_1;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  undefined4 in_stack_fffffffffffff0d8;
  int in_stack_fffffffffffff0dc;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff0e0;
  undefined1 *in_stack_fffffffffffff0e8;
  cpp_dec_float<200U,_int,_void> *in_stack_fffffffffffff0f0;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff0f8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_ef8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_ef0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_ee8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_ee0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_ed8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_ed0;
  undefined1 local_eb8 [128];
  undefined1 local_e38 [128];
  undefined1 local_db8 [128];
  undefined1 local_d38 [128];
  undefined1 local_cb8 [128];
  undefined1 local_c38 [128];
  undefined1 local_bb8 [384];
  int local_a38;
  undefined1 local_a34 [128];
  undefined1 local_9b4 [256];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_8b4;
  undefined1 local_834 [128];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_7b4;
  undefined1 local_734 [128];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_6b4;
  int local_634;
  undefined8 local_630;
  undefined1 local_628 [256];
  undefined8 local_528;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_520;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_4a0;
  undefined8 local_420;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_418;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_398;
  undefined8 local_310;
  undefined8 local_308;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_300;
  undefined8 local_2f8;
  undefined8 *local_2f0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2e8;
  undefined8 local_2e0;
  undefined8 local_2d8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2d0;
  undefined8 local_2c8;
  undefined8 *local_2c0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2b8;
  undefined8 local_2b0;
  undefined8 local_2a8;
  undefined1 *local_2a0;
  undefined8 local_298;
  undefined8 *local_290;
  undefined1 *local_288;
  undefined8 local_280;
  undefined8 local_278;
  undefined1 *local_270;
  undefined8 local_268;
  undefined8 local_260;
  undefined1 *local_258;
  undefined8 local_250;
  undefined8 local_248;
  undefined1 *local_240;
  undefined8 local_238;
  undefined8 local_230;
  undefined1 *local_228;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_220;
  undefined1 *local_218;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_210;
  undefined1 *local_208;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_200;
  undefined1 *local_1f8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1f0;
  undefined1 *local_1e8;
  undefined1 *local_1e0;
  long local_1d8;
  undefined1 *local_1d0;
  long local_1c8;
  undefined1 *local_1c0;
  long local_1b8;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  undefined1 *local_198;
  cpp_dec_float<200U,_int,_void> *local_190;
  undefined1 *local_188;
  undefined1 *local_180;
  undefined1 *local_178;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_170;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_168;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_160;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_158;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_150;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_148;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_140;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_138;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_130;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_128;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_120;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_118;
  undefined8 local_110;
  undefined8 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 *local_f0;
  undefined8 local_e8;
  undefined8 *local_e0;
  undefined8 local_d8;
  undefined8 *local_d0;
  undefined8 local_c8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_b9;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b0;
  undefined1 *local_a8;
  undefined1 *local_a0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_98;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_90;
  undefined1 *local_88;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_79;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_78;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_58;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_50;
  undefined1 *local_48;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_39;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_38;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_18;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_10;
  undefined1 *local_8;
  
  local_308 = infinity();
  local_300 = &local_398;
  local_310 = 0;
  local_c8 = local_308;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (in_stack_fffffffffffff0f0,(double)in_stack_fffffffffffff0e8,in_stack_fffffffffffff0e0);
  local_420._0_1_ = false;
  local_420._1_3_ = 0;
  local_420._4_4_ = cpp_dec_float_finite;
  local_2e8 = &local_418;
  local_2f0 = &local_420;
  local_2f8 = 0;
  local_d0 = local_2f0;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (in_stack_fffffffffffff0f0,(double)in_stack_fffffffffffff0e8,in_stack_fffffffffffff0e0);
  local_2d8 = infinity();
  local_2d0 = &local_4a0;
  local_2e0 = 0;
  local_d8 = local_2d8;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (in_stack_fffffffffffff0f0,(double)in_stack_fffffffffffff0e8,in_stack_fffffffffffff0e0);
  local_528._0_4_ = 0;
  local_528._4_4_ = 0;
  local_2b8 = &local_520;
  local_2c0 = &local_528;
  local_2c8 = 0;
  local_e0 = local_2c0;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (in_stack_fffffffffffff0f0,(double)in_stack_fffffffffffff0e8,in_stack_fffffffffffff0e0);
  local_2a8 = infinity();
  local_2a0 = local_628 + 0x80;
  local_2b0 = 0;
  local_e8 = local_2a8;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (in_stack_fffffffffffff0f0,(double)in_stack_fffffffffffff0e8,in_stack_fffffffffffff0e0);
  local_630 = 0;
  local_288 = local_628;
  local_290 = &local_630;
  local_298 = 0;
  local_f0 = local_290;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (in_stack_fffffffffffff0f0,(double)in_stack_fffffffffffff0e8,in_stack_fffffffffffff0e0);
  for (local_634 = 0; iVar1 = local_634,
      iVar3 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)0x6ad00d), iVar1 < iVar3; local_634 = local_634 + 1) {
    local_220 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::lower(in_stack_fffffffffffff0e0,in_stack_fffffffffffff0dc);
    local_218 = local_734;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffff0e0,
               (cpp_dec_float<200U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffff0dc,in_stack_fffffffffffff0d8));
    spxAbs<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
              ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)CONCAT44(in_stack_fffffffffffff0dc,in_stack_fffffffffffff0d8));
    local_210 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::lower(in_stack_fffffffffffff0e0,in_stack_fffffffffffff0dc);
    local_208 = local_834;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffff0e0,
               (cpp_dec_float<200U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffff0dc,in_stack_fffffffffffff0d8));
    spxAbs<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
              ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)CONCAT44(in_stack_fffffffffffff0dc,in_stack_fffffffffffff0d8));
    SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::obj(in_stack_fffffffffffff0f8,(int)((ulong)in_stack_fffffffffffff0f0 >> 0x20));
    spxAbs<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
              ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)CONCAT44(in_stack_fffffffffffff0dc,in_stack_fffffffffffff0d8));
    local_278 = infinity();
    local_270 = local_9b4;
    local_280 = 0;
    local_f8 = local_278;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              (in_stack_fffffffffffff0f0,(double)in_stack_fffffffffffff0e8,in_stack_fffffffffffff0e0
              );
    tVar2 = boost::multiprecision::operator<
                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)CONCAT44(in_stack_fffffffffffff0dc,in_stack_fffffffffffff0d8),
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)0x6ad15a);
    if (tVar2) {
      tVar2 = boost::multiprecision::operator<
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT44(in_stack_fffffffffffff0dc,in_stack_fffffffffffff0d8),
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x6ad178);
      if (tVar2) {
        local_ed0 = &local_4a0;
      }
      else {
        local_ed0 = &local_6b4;
      }
      local_118 = &local_4a0;
      local_120 = local_ed0;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                ((cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffff0e0,
                 (cpp_dec_float<200U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffff0dc,in_stack_fffffffffffff0d8));
      tVar2 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT44(in_stack_fffffffffffff0dc,in_stack_fffffffffffff0d8),
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x6ad1e3);
      if (tVar2) {
        local_ed8 = &local_520;
      }
      else {
        local_ed8 = &local_6b4;
      }
      local_128 = &local_520;
      local_130 = local_ed8;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                ((cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffff0e0,
                 (cpp_dec_float<200U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffff0dc,in_stack_fffffffffffff0d8));
    }
    local_260 = infinity();
    local_258 = local_a34;
    local_268 = 0;
    local_100 = local_260;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              (in_stack_fffffffffffff0f0,(double)in_stack_fffffffffffff0e8,in_stack_fffffffffffff0e0
              );
    tVar2 = boost::multiprecision::operator<
                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)CONCAT44(in_stack_fffffffffffff0dc,in_stack_fffffffffffff0d8),
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)0x6ad2a4);
    if (tVar2) {
      tVar2 = boost::multiprecision::operator<
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT44(in_stack_fffffffffffff0dc,in_stack_fffffffffffff0d8),
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x6ad2c2);
      if (tVar2) {
        local_ee0 = &local_4a0;
      }
      else {
        local_ee0 = &local_7b4;
      }
      local_138 = &local_4a0;
      local_140 = local_ee0;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                ((cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffff0e0,
                 (cpp_dec_float<200U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffff0dc,in_stack_fffffffffffff0d8));
      tVar2 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT44(in_stack_fffffffffffff0dc,in_stack_fffffffffffff0d8),
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x6ad32d);
      if (tVar2) {
        local_ee8 = &local_520;
      }
      else {
        local_ee8 = &local_7b4;
      }
      local_148 = &local_520;
      local_150 = local_ee8;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                ((cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffff0e0,
                 (cpp_dec_float<200U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffff0dc,in_stack_fffffffffffff0d8));
    }
    tVar2 = boost::multiprecision::operator<
                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)CONCAT44(in_stack_fffffffffffff0dc,in_stack_fffffffffffff0d8),
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)0x6ad398);
    if (tVar2) {
      local_ef0 = &local_398;
    }
    else {
      local_ef0 = &local_8b4;
    }
    local_158 = &local_398;
    local_160 = local_ef0;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
              ((cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffff0e0,
               (cpp_dec_float<200U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffff0dc,in_stack_fffffffffffff0d8));
    tVar2 = boost::multiprecision::operator>
                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)CONCAT44(in_stack_fffffffffffff0dc,in_stack_fffffffffffff0d8),
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)0x6ad403);
    if (tVar2) {
      local_ef8 = &local_418;
    }
    else {
      local_ef8 = &local_8b4;
    }
    local_168 = &local_418;
    local_170 = local_ef8;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
              ((cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffff0e0,
               (cpp_dec_float<200U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffff0dc,in_stack_fffffffffffff0d8));
  }
  for (local_a38 = 0; iVar1 = local_a38,
      iVar3 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)0x6ad48f), iVar1 < iVar3; local_a38 = local_a38 + 1) {
    local_200 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::lhs(in_stack_fffffffffffff0e0,in_stack_fffffffffffff0dc);
    local_1f8 = local_bb8 + 0x80;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffff0e0,
               (cpp_dec_float<200U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffff0dc,in_stack_fffffffffffff0d8));
    spxAbs<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
              ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)CONCAT44(in_stack_fffffffffffff0dc,in_stack_fffffffffffff0d8));
    local_1f0 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::rhs(in_stack_fffffffffffff0e0,in_stack_fffffffffffff0dc);
    local_1e8 = local_c38;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffff0e0,
               (cpp_dec_float<200U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffff0dc,in_stack_fffffffffffff0d8));
    spxAbs<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
              ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)CONCAT44(in_stack_fffffffffffff0dc,in_stack_fffffffffffff0d8));
    local_248 = infinity();
    local_240 = local_cb8;
    local_250 = 0;
    local_108 = local_248;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              (in_stack_fffffffffffff0f0,(double)in_stack_fffffffffffff0e8,in_stack_fffffffffffff0e0
              );
    tVar2 = boost::multiprecision::operator>
                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)CONCAT44(in_stack_fffffffffffff0dc,in_stack_fffffffffffff0d8),
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)0x6ad5ae);
    if (tVar2) {
      tVar2 = boost::multiprecision::operator<
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT44(in_stack_fffffffffffff0dc,in_stack_fffffffffffff0d8),
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x6ad5cc);
      if (tVar2) {
        local_180 = local_628 + 0x80;
      }
      else {
        local_180 = local_bb8 + 0x100;
      }
      local_178 = local_628 + 0x80;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                ((cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffff0e0,
                 (cpp_dec_float<200U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffff0dc,in_stack_fffffffffffff0d8));
      tVar2 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT44(in_stack_fffffffffffff0dc,in_stack_fffffffffffff0d8),
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x6ad637);
      if (tVar2) {
        in_stack_fffffffffffff0f0 = (cpp_dec_float<200U,_int,_void> *)local_628;
      }
      else {
        in_stack_fffffffffffff0f0 = (cpp_dec_float<200U,_int,_void> *)(local_bb8 + 0x100);
      }
      local_188 = local_628;
      local_190 = in_stack_fffffffffffff0f0;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                ((cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffff0e0,
                 (cpp_dec_float<200U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffff0dc,in_stack_fffffffffffff0d8));
    }
    local_230 = infinity();
    local_228 = local_d38;
    local_238 = 0;
    local_110 = local_230;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              (in_stack_fffffffffffff0f0,(double)in_stack_fffffffffffff0e8,in_stack_fffffffffffff0e0
              );
    tVar2 = boost::multiprecision::operator<
                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)CONCAT44(in_stack_fffffffffffff0dc,in_stack_fffffffffffff0d8),
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)0x6ad6f8);
    if (tVar2) {
      tVar2 = boost::multiprecision::operator<
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT44(in_stack_fffffffffffff0dc,in_stack_fffffffffffff0d8),
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x6ad716);
      if (tVar2) {
        in_stack_fffffffffffff0e8 = local_628 + 0x80;
      }
      else {
        in_stack_fffffffffffff0e8 = local_bb8;
      }
      local_198 = local_628 + 0x80;
      local_1a0 = in_stack_fffffffffffff0e8;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                ((cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffff0e0,
                 (cpp_dec_float<200U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffff0dc,in_stack_fffffffffffff0d8));
      tVar2 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT44(in_stack_fffffffffffff0dc,in_stack_fffffffffffff0d8),
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x6ad781);
      if (tVar2) {
        in_stack_fffffffffffff0e0 =
             (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)local_628;
      }
      else {
        in_stack_fffffffffffff0e0 =
             (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)local_bb8;
      }
      local_1a8 = local_628;
      local_1b0 = in_stack_fffffffffffff0e0;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                ((cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffff0e0,
                 (cpp_dec_float<200U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffff0dc,in_stack_fffffffffffff0d8));
    }
  }
  local_28 = local_db8;
  local_30 = &local_520;
  local_38 = &local_4a0;
  boost::multiprecision::detail::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  ::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
            (&local_39,local_30,local_38);
  local_20 = local_db8;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffff0e0);
  local_8 = local_db8;
  local_10 = local_30;
  local_18 = local_38;
  boost::multiprecision::default_ops::
  eval_subtract<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            ((cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffff0e0,
             (cpp_dec_float<200U,_int,_void> *)
             CONCAT44(in_stack_fffffffffffff0dc,in_stack_fffffffffffff0d8),
             (cpp_dec_float<200U,_int,_void> *)0x6ad8a6);
  local_1b8 = in_RDI + 0x11e8;
  local_1c0 = local_db8;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
            ((cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffff0e0,
             (cpp_dec_float<200U,_int,_void> *)
             CONCAT44(in_stack_fffffffffffff0dc,in_stack_fffffffffffff0d8));
  local_68 = local_e38;
  local_70 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)local_628;
  local_78 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)(local_628 + 0x80);
  boost::multiprecision::detail::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  ::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
            (&local_79,local_70,local_78);
  local_60 = local_e38;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffff0e0);
  local_48 = local_e38;
  local_50 = local_70;
  local_58 = local_78;
  boost::multiprecision::default_ops::
  eval_subtract<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            ((cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffff0e0,
             (cpp_dec_float<200U,_int,_void> *)
             CONCAT44(in_stack_fffffffffffff0dc,in_stack_fffffffffffff0d8),
             (cpp_dec_float<200U,_int,_void> *)0x6ad995);
  local_1c8 = in_RDI + 0x1268;
  local_1d0 = local_e38;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
            ((cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffff0e0,
             (cpp_dec_float<200U,_int,_void> *)
             CONCAT44(in_stack_fffffffffffff0dc,in_stack_fffffffffffff0d8));
  local_a8 = local_eb8;
  local_b0 = &local_418;
  local_b8 = &local_398;
  boost::multiprecision::detail::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  ::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
            (&local_b9,local_b0,local_b8);
  local_a0 = local_eb8;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffff0e0);
  local_88 = local_eb8;
  local_90 = local_b0;
  local_98 = local_b8;
  boost::multiprecision::default_ops::
  eval_subtract<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            ((cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffff0e0,
             (cpp_dec_float<200U,_int,_void> *)
             CONCAT44(in_stack_fffffffffffff0dc,in_stack_fffffffffffff0d8),
             (cpp_dec_float<200U,_int,_void> *)0x6ada7b);
  local_1d8 = in_RDI + 0x12e8;
  local_1e0 = local_eb8;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
            ((cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffff0e0,
             (cpp_dec_float<200U,_int,_void> *)
             CONCAT44(in_stack_fffffffffffff0dc,in_stack_fffffffffffff0d8));
  return;
}

Assistant:

void SPxSolverBase<R>::calculateProblemRanges()
{
   // only collect absolute values
   R minobj = R(infinity);
   R maxobj = 0.0;
   R minbound = R(infinity);
   R maxbound = 0.0;
   R minside = R(infinity);
   R maxside = 0.0;

   // get min and max absolute values of bounds and objective
   for(int j = 0; j < this->nCols(); ++j)
   {
      R abslow = spxAbs(this->lower(j));
      R absupp = spxAbs(this->lower(j));
      R absobj = spxAbs(this->obj(j));

      if(abslow < R(infinity))
      {
         minbound = SOPLEX_MIN(minbound, abslow);
         maxbound = SOPLEX_MAX(maxbound, abslow);
      }

      if(absupp < R(infinity))
      {
         minbound = SOPLEX_MIN(minbound, absupp);
         maxbound = SOPLEX_MAX(maxbound, absupp);
      }

      minobj = SOPLEX_MIN(minobj, absobj);
      maxobj = SOPLEX_MAX(maxobj, absobj);
   }

   // get min and max absoute values of sides
   for(int i = 0; i < this->nRows(); ++i)
   {
      R abslhs = spxAbs(this->lhs(i));
      R absrhs = spxAbs(this->rhs(i));

      if(abslhs > R(infinity))
      {
         minside = SOPLEX_MIN(minside, abslhs);
         maxside = SOPLEX_MAX(maxside, abslhs);
      }

      if(absrhs < R(infinity))
      {
         minside = SOPLEX_MIN(minside, absrhs);
         maxside = SOPLEX_MAX(maxside, absrhs);
      }
   }

   boundrange = maxbound - minbound;
   siderange = maxside - minside;
   objrange = maxobj - minobj;
}